

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableMergeDrawChannels(ImGuiTable *table)

{
  ImVec2 *pIVar1;
  undefined8 *puVar2;
  int *piVar3;
  ImVector<unsigned_short> *pIVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImVector<ImDrawCmd> IVar8;
  char cVar9;
  char cVar10;
  byte bVar11;
  ImDrawCmd *pIVar12;
  ImDrawChannel *pIVar13;
  float *pfVar14;
  ImDrawChannel *pIVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  undefined8 uVar19;
  unsigned_short *puVar20;
  ImGuiContext *pIVar21;
  int n;
  long lVar22;
  ulong uVar23;
  long lVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int n_2;
  ImRect *this;
  MergeGroup *merge_group;
  ulong uVar28;
  uint uVar29;
  ImGuiTableColumn *pIVar30;
  ulong uVar31;
  ImDrawChannel *pIVar32;
  int merge_group_sub_n;
  int iVar33;
  uint uVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  ImBitArray<132> remaining_mask;
  ImRect local_d8;
  int iStack_c8;
  uint local_c4 [37];
  
  pIVar21 = GImGui;
  cVar9 = table->FreezeRowsCount;
  cVar10 = table->FreezeColumnsCount;
  uVar31 = 0;
  memset(&local_d8,0,0xa0);
  uVar29 = 0;
  do {
    if ((long)table->ColumnsCount <= (long)uVar31) {
      if (uVar29 != 0) {
        ImVector<ImDrawChannel>::resize
                  (&pIVar21->DrawChannelsTempMergeBuffer,(table->DrawSplitter)._Count + -2);
        pIVar32 = (pIVar21->DrawChannelsTempMergeBuffer).Data;
        remaining_mask.Storage[0] = 0;
        remaining_mask.Storage[1] = 0;
        remaining_mask.Storage[2] = 0;
        remaining_mask.Storage[3] = 0;
        remaining_mask.Storage[4] = 0;
        ImBitArraySetBitRange(remaining_mask.Storage,2,(table->DrawSplitter)._Count);
        bVar11 = table->Bg2DrawChannelUnfrozen & 0x1f;
        remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] =
             remaining_mask.Storage[table->Bg2DrawChannelUnfrozen >> 5] &
             (-2 << bVar11 | 0xfffffffeU >> 0x20 - bVar11);
        iVar33 = ((table->DrawSplitter)._Count - (uint)('\0' < cVar9)) + -2;
        fVar35 = (table->HostClipRect).Min.x;
        fVar5 = (table->HostClipRect).Min.y;
        fVar6 = (table->HostClipRect).Max.x;
        fVar7 = (table->HostClipRect).Max.y;
        lVar24 = (long)local_c4;
        for (uVar31 = 0; uVar31 != 4; uVar31 = uVar31 + 1) {
          lVar22 = uVar31 * 0x28;
          iVar25 = (&iStack_c8)[uVar31 * 10];
          if (iVar25 != 0) {
            fVar36 = *(float *)((long)&local_d8 + lVar22);
            fVar37 = *(float *)((long)&local_d8 + lVar22 + 4);
            fVar39 = *(float *)((long)&local_d8 + lVar22 + 8);
            fVar38 = *(float *)((long)&local_d8 + lVar22 + 0xc);
            if (((uVar31 & 1) == 0 || cVar10 < '\x01') && (fVar35 <= fVar36)) {
              fVar36 = fVar35;
            }
            if ((uVar31 < 2 || cVar9 < '\x01') && (fVar5 <= fVar37)) {
              fVar37 = fVar5;
            }
            if ((uVar31 & 1) != 0) {
              uVar29 = -(uint)(fVar6 <= fVar39);
              fVar39 = (float)(~uVar29 & (uint)fVar6 | (uint)fVar39 & uVar29);
            }
            if ((1 < uVar31) && ((table->Flags & 0x20000) == 0)) {
              uVar29 = -(uint)(fVar7 <= fVar38);
              fVar38 = (float)(~uVar29 & (uint)fVar7 | (uint)fVar38 & uVar29);
            }
            for (lVar22 = 0; lVar22 != 5; lVar22 = lVar22 + 1) {
              remaining_mask.Storage[lVar22] =
                   remaining_mask.Storage[lVar22] & ~*(uint *)(lVar24 + lVar22 * 4);
            }
            uVar23 = 0;
            lVar22 = 8;
            iVar27 = iVar25;
            while (((long)uVar23 < (long)(table->DrawSplitter)._Count && (iVar27 != 0))) {
              uVar28 = uVar23 >> 5 & 0x7ffffff;
              if ((local_c4[uVar31 * 10 + uVar28] >> ((uint)uVar23 & 0x1f) & 1) != 0) {
                local_c4[uVar31 * 10 + uVar28] =
                     local_c4[uVar31 * 10 + uVar28] & ~(1 << ((byte)uVar23 & 0x1f));
                iVar27 = iVar27 + -1;
                pIVar13 = (table->DrawSplitter)._Channels.Data;
                pfVar14 = *(float **)((long)&(pIVar13->_CmdBuffer).Size + lVar22);
                *pfVar14 = fVar36;
                pfVar14[1] = fVar37;
                pfVar14[2] = fVar39;
                pfVar14[3] = fVar38;
                puVar2 = (undefined8 *)((long)pIVar13 + lVar22 + -8);
                uVar19 = *puVar2;
                pIVar12 = (ImDrawCmd *)puVar2[1];
                piVar3 = (int *)((long)&(pIVar13->_CmdBuffer).Data + lVar22);
                iVar16 = piVar3[1];
                iVar17 = piVar3[2];
                iVar18 = piVar3[3];
                (pIVar32->_IdxBuffer).Size = *piVar3;
                (pIVar32->_IdxBuffer).Capacity = iVar16;
                *(int *)&(pIVar32->_IdxBuffer).Data = iVar17;
                *(int *)((long)&(pIVar32->_IdxBuffer).Data + 4) = iVar18;
                (pIVar32->_CmdBuffer).Size = (int)uVar19;
                (pIVar32->_CmdBuffer).Capacity = (int)((ulong)uVar19 >> 0x20);
                (pIVar32->_CmdBuffer).Data = pIVar12;
                pIVar32 = pIVar32 + 1;
              }
              uVar23 = uVar23 + 1;
              lVar22 = lVar22 + 0x20;
            }
            iVar33 = iVar33 - iVar25;
          }
          if (uVar31 == 1 && '\0' < cVar9) {
            pIVar15 = (table->DrawSplitter)._Channels.Data;
            pIVar13 = pIVar15 + table->Bg2DrawChannelUnfrozen;
            iVar27 = (pIVar13->_CmdBuffer).Size;
            iVar16 = (pIVar13->_CmdBuffer).Capacity;
            pIVar12 = (pIVar13->_CmdBuffer).Data;
            pIVar4 = &pIVar15[table->Bg2DrawChannelUnfrozen]._IdxBuffer;
            iVar25 = pIVar4->Capacity;
            puVar20 = pIVar4->Data;
            (pIVar32->_IdxBuffer).Size = pIVar4->Size;
            (pIVar32->_IdxBuffer).Capacity = iVar25;
            (pIVar32->_IdxBuffer).Data = puVar20;
            (pIVar32->_CmdBuffer).Size = iVar27;
            (pIVar32->_CmdBuffer).Capacity = iVar16;
            (pIVar32->_CmdBuffer).Data = pIVar12;
            pIVar32 = pIVar32 + 1;
          }
          lVar24 = lVar24 + 0x28;
        }
        lVar24 = 0;
        uVar31 = 0;
        while ((lVar22 = (long)(table->DrawSplitter)._Count, (long)uVar31 < lVar22 && (iVar33 != 0))
              ) {
          if ((remaining_mask.Storage[uVar31 >> 5 & 0x7ffffff] >> ((uint)uVar31 & 0x1f) & 1) != 0) {
            pIVar13 = (table->DrawSplitter)._Channels.Data;
            IVar8 = *(ImVector<ImDrawCmd> *)((long)&(pIVar13->_CmdBuffer).Size + lVar24);
            puVar2 = (undefined8 *)((long)&(pIVar13->_IdxBuffer).Size + lVar24);
            uVar19 = *puVar2;
            puVar20 = (unsigned_short *)puVar2[1];
            (pIVar32->_IdxBuffer).Size = (int)uVar19;
            (pIVar32->_IdxBuffer).Capacity = (int)((ulong)uVar19 >> 0x20);
            (pIVar32->_IdxBuffer).Data = puVar20;
            pIVar32->_CmdBuffer = IVar8;
            pIVar32 = pIVar32 + 1;
            iVar33 = iVar33 + -1;
          }
          uVar31 = uVar31 + 1;
          lVar24 = lVar24 + 0x20;
        }
        memcpy((table->DrawSplitter)._Channels.Data + 2,(pIVar21->DrawChannelsTempMergeBuffer).Data,
               lVar22 * 0x20 - 0x40);
      }
      return;
    }
    if ((table->VisibleMaskByIndex >> (uVar31 & 0x3f) & 1) != 0) {
      pIVar30 = (table->Columns).Data + uVar31;
      for (iVar33 = 0; ('\0' < cVar9) + 1 != iVar33; iVar33 = iVar33 + 1) {
        bVar11 = *(byte *)((long)pIVar30 + (0x59 - (ulong)(iVar33 == 0)));
        pIVar32 = (table->DrawSplitter)._Channels.Data;
        iVar25 = pIVar32[bVar11]._CmdBuffer.Size;
        if (0 < (long)iVar25) {
          pIVar32 = pIVar32 + bVar11;
          pIVar12 = (pIVar32->_CmdBuffer).Data;
          if (pIVar12[(long)iVar25 + -1].ElemCount == 0) {
            iVar25 = iVar25 + -1;
            (pIVar32->_CmdBuffer).Size = iVar25;
          }
          if (iVar25 == 1) {
            if ((pIVar30->Flags & 0x80) == 0) {
              if (cVar9 < '\x01') {
                fVar35 = pIVar30->ContentMaxXUnfrozen;
LAB_00150822:
                uVar34 = -(uint)(pIVar30->ContentMaxXHeadersUsed <= fVar35);
                fVar35 = (float)(~uVar34 & (uint)pIVar30->ContentMaxXHeadersUsed |
                                (uint)fVar35 & uVar34);
              }
              else {
                if (iVar33 == 0) {
                  fVar35 = pIVar30->ContentMaxXFrozen;
                  goto LAB_00150822;
                }
                fVar35 = pIVar30->ContentMaxXUnfrozen;
              }
              pIVar1 = &(pIVar30->ClipRect).Max;
              if (pIVar1->x <= fVar35 && fVar35 != pIVar1->x) goto LAB_001508cb;
            }
            uVar34 = 1;
            if ('\0' < cVar10) {
              uVar34 = (uint)((long)table->FreezeColumnsCount <= (long)uVar31);
            }
            uVar26 = (uint)(iVar33 != 0) * 2;
            if (cVar9 < '\x01') {
              uVar26 = 2;
            }
            uVar23 = (ulong)(uVar26 | uVar34);
            this = (ImRect *)((long)&local_d8 + uVar23 * 0x28);
            iVar25 = (&iStack_c8)[uVar23 * 10];
            if (iVar25 == 0) {
              (this->Min).x = 3.4028235e+38;
              (this->Min).y = 3.4028235e+38;
              *(undefined8 *)((long)&local_d8 + uVar23 * 0x28 + 8) = 0xff7fffffff7fffff;
            }
            local_c4[uVar23 * 10 + (ulong)(bVar11 >> 5)] =
                 local_c4[uVar23 * 10 + (ulong)(bVar11 >> 5)] | 1 << (bVar11 & 0x1f);
            (&iStack_c8)[uVar23 * 10] = iVar25 + 1;
            remaining_mask.Storage[0] = (ImU32)(pIVar12->ClipRect).x;
            remaining_mask.Storage[1] = (ImU32)(pIVar12->ClipRect).y;
            remaining_mask.Storage[2] = (ImU32)(pIVar12->ClipRect).z;
            remaining_mask.Storage[3] = (ImU32)(pIVar12->ClipRect).w;
            ImRect::Add(this,(ImRect *)&remaining_mask);
            uVar29 = uVar29 | 1 << (uVar26 | uVar34);
          }
        }
LAB_001508cb:
      }
      pIVar30->DrawChannelCurrent = 0xff;
    }
    uVar31 = uVar31 + 1;
  } while( true );
}

Assistant:

void ImGui::TableMergeDrawChannels(ImGuiTable* table)
{
    ImGuiContext& g = *GImGui;
    ImDrawListSplitter* splitter = &table->DrawSplitter;
    const bool has_freeze_v = (table->FreezeRowsCount > 0);
    const bool has_freeze_h = (table->FreezeColumnsCount > 0);
    IM_ASSERT(splitter->_Current == 0);

    // Track which groups we are going to attempt to merge, and which channels goes into each group.
    struct MergeGroup
    {
        ImRect  ClipRect;
        int     ChannelsCount;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> ChannelsMask;
    };
    int merge_group_mask = 0x00;
    MergeGroup merge_groups[4];
    memset(merge_groups, 0, sizeof(merge_groups));

    // 1. Scan channels and take note of those which can be merged
    for (int column_n = 0; column_n < table->ColumnsCount; column_n++)
    {
        if ((table->VisibleMaskByIndex & ((ImU64)1 << column_n)) == 0)
            continue;
        ImGuiTableColumn* column = &table->Columns[column_n];

        const int merge_group_sub_count = has_freeze_v ? 2 : 1;
        for (int merge_group_sub_n = 0; merge_group_sub_n < merge_group_sub_count; merge_group_sub_n++)
        {
            const int channel_no = (merge_group_sub_n == 0) ? column->DrawChannelFrozen : column->DrawChannelUnfrozen;

            // Don't attempt to merge if there are multiple draw calls within the column
            ImDrawChannel* src_channel = &splitter->_Channels[channel_no];
            if (src_channel->_CmdBuffer.Size > 0 && src_channel->_CmdBuffer.back().ElemCount == 0)
                src_channel->_CmdBuffer.pop_back();
            if (src_channel->_CmdBuffer.Size != 1)
                continue;

            // Find out the width of this merge group and check if it will fit in our column
            // (note that we assume that rendering didn't stray on the left direction. we should need a CursorMinPos to detect it)
            if (!(column->Flags & ImGuiTableColumnFlags_NoClip))
            {
                float content_max_x;
                if (!has_freeze_v)
                    content_max_x = ImMax(column->ContentMaxXUnfrozen, column->ContentMaxXHeadersUsed); // No row freeze
                else if (merge_group_sub_n == 0)
                    content_max_x = ImMax(column->ContentMaxXFrozen, column->ContentMaxXHeadersUsed);   // Row freeze: use width before freeze
                else
                    content_max_x = column->ContentMaxXUnfrozen;                                        // Row freeze: use width after freeze
                if (content_max_x > column->ClipRect.Max.x)
                    continue;
            }

            const int merge_group_n = (has_freeze_h && column_n < table->FreezeColumnsCount ? 0 : 1) + (has_freeze_v && merge_group_sub_n == 0 ? 0 : 2);
            IM_ASSERT(channel_no < IMGUI_TABLE_MAX_DRAW_CHANNELS);
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                merge_group->ClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
            merge_group->ChannelsMask.SetBit(channel_no);
            merge_group->ChannelsCount++;
            merge_group->ClipRect.Add(src_channel->_CmdBuffer[0].ClipRect);
            merge_group_mask |= (1 << merge_group_n);
        }

        // Invalidate current draw channel
        // (we don't clear DrawChannelFrozen/DrawChannelUnfrozen solely to facilitate debugging/later inspection of data)
        column->DrawChannelCurrent = (ImGuiTableDrawChannelIdx)-1;
    }

    // [DEBUG] Display merge groups
#if 0
    if (g.IO.KeyShift)
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            MergeGroup* merge_group = &merge_groups[merge_group_n];
            if (merge_group->ChannelsCount == 0)
                continue;
            char buf[32];
            ImFormatString(buf, 32, "MG%d:%d", merge_group_n, merge_group->ChannelsCount);
            ImVec2 text_pos = merge_group->ClipRect.Min + ImVec2(4, 4);
            ImVec2 text_size = CalcTextSize(buf, NULL);
            GetForegroundDrawList()->AddRectFilled(text_pos, text_pos + text_size, IM_COL32(0, 0, 0, 255));
            GetForegroundDrawList()->AddText(text_pos, IM_COL32(255, 255, 0, 255), buf, NULL);
            GetForegroundDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 255, 0, 255));
        }
#endif

    // 2. Rewrite channel list in our preferred order
    if (merge_group_mask != 0)
    {
        // We skip channel 0 (Bg0/Bg1) and 1 (Bg2 frozen) from the shuffling since they won't move - see channels allocation in TableSetupDrawChannels().
        const int LEADING_DRAW_CHANNELS = 2;
        g.DrawChannelsTempMergeBuffer.resize(splitter->_Count - LEADING_DRAW_CHANNELS); // Use shared temporary storage so the allocation gets amortized
        ImDrawChannel* dst_tmp = g.DrawChannelsTempMergeBuffer.Data;
        ImBitArray<IMGUI_TABLE_MAX_DRAW_CHANNELS> remaining_mask;                       // We need 132-bit of storage
        remaining_mask.ClearAllBits();
        remaining_mask.SetBitRange(LEADING_DRAW_CHANNELS, splitter->_Count);
        remaining_mask.ClearBit(table->Bg2DrawChannelUnfrozen);
        IM_ASSERT(has_freeze_v == false || table->Bg2DrawChannelUnfrozen != TABLE_DRAW_CHANNEL_BG2_FROZEN);
        int remaining_count = splitter->_Count - (has_freeze_v ? LEADING_DRAW_CHANNELS + 1 : LEADING_DRAW_CHANNELS);
        //ImRect host_rect = (table->InnerWindow == table->OuterWindow) ? table->InnerClipRect : table->HostClipRect;
        ImRect host_rect = table->HostClipRect;
        for (int merge_group_n = 0; merge_group_n < IM_ARRAYSIZE(merge_groups); merge_group_n++)
        {
            if (int merge_channels_count = merge_groups[merge_group_n].ChannelsCount)
            {
                MergeGroup* merge_group = &merge_groups[merge_group_n];
                ImRect merge_clip_rect = merge_group->ClipRect;

                // Extend outer-most clip limits to match those of host, so draw calls can be merged even if
                // outer-most columns have some outer padding offsetting them from their parent ClipRect.
                // The principal cases this is dealing with are:
                // - On a same-window table (not scrolling = single group), all fitting columns ClipRect -> will extend and match host ClipRect -> will merge
                // - Columns can use padding and have left-most ClipRect.Min.x and right-most ClipRect.Max.x != from host ClipRect -> will extend and match host ClipRect -> will merge
                // FIXME-TABLE FIXME-WORKRECT: We are wasting a merge opportunity on tables without scrolling if column doesn't fit
                // within host clip rect, solely because of the half-padding difference between window->WorkRect and window->InnerClipRect.
                if ((merge_group_n & 1) == 0 || !has_freeze_h)
                    merge_clip_rect.Min.x = ImMin(merge_clip_rect.Min.x, host_rect.Min.x);
                if ((merge_group_n & 2) == 0 || !has_freeze_v)
                    merge_clip_rect.Min.y = ImMin(merge_clip_rect.Min.y, host_rect.Min.y);
                if ((merge_group_n & 1) != 0)
                    merge_clip_rect.Max.x = ImMax(merge_clip_rect.Max.x, host_rect.Max.x);
                if ((merge_group_n & 2) != 0 && (table->Flags & ImGuiTableFlags_NoHostExtendY) == 0)
                    merge_clip_rect.Max.y = ImMax(merge_clip_rect.Max.y, host_rect.Max.y);
#if 0
                GetOverlayDrawList()->AddRect(merge_group->ClipRect.Min, merge_group->ClipRect.Max, IM_COL32(255, 0, 0, 200), 0.0f, ~0, 1.0f);
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Min, merge_clip_rect.Min, IM_COL32(255, 100, 0, 200));
                GetOverlayDrawList()->AddLine(merge_group->ClipRect.Max, merge_clip_rect.Max, IM_COL32(255, 100, 0, 200));
#endif
                remaining_count -= merge_group->ChannelsCount;
                for (int n = 0; n < IM_ARRAYSIZE(remaining_mask.Storage); n++)
                    remaining_mask.Storage[n] &= ~merge_group->ChannelsMask.Storage[n];
                for (int n = 0; n < splitter->_Count && merge_channels_count != 0; n++)
                {
                    // Copy + overwrite new clip rect
                    if (!merge_group->ChannelsMask.TestBit(n))
                        continue;
                    merge_group->ChannelsMask.ClearBit(n);
                    merge_channels_count--;

                    ImDrawChannel* channel = &splitter->_Channels[n];
                    IM_ASSERT(channel->_CmdBuffer.Size == 1 && merge_clip_rect.Contains(ImRect(channel->_CmdBuffer[0].ClipRect)));
                    channel->_CmdBuffer[0].ClipRect = merge_clip_rect.ToVec4();
                    memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
                }
            }

            // Make sure Bg2DrawChannelUnfrozen appears in the middle of our groups (whereas Bg0/Bg1 and Bg2 frozen are fixed to 0 and 1)
            if (merge_group_n == 1 && has_freeze_v)
                memcpy(dst_tmp++, &splitter->_Channels[table->Bg2DrawChannelUnfrozen], sizeof(ImDrawChannel));
        }

        // Append unmergeable channels that we didn't reorder at the end of the list
        for (int n = 0; n < splitter->_Count && remaining_count != 0; n++)
        {
            if (!remaining_mask.TestBit(n))
                continue;
            ImDrawChannel* channel = &splitter->_Channels[n];
            memcpy(dst_tmp++, channel, sizeof(ImDrawChannel));
            remaining_count--;
        }
        IM_ASSERT(dst_tmp == g.DrawChannelsTempMergeBuffer.Data + g.DrawChannelsTempMergeBuffer.Size);
        memcpy(splitter->_Channels.Data + LEADING_DRAW_CHANNELS, g.DrawChannelsTempMergeBuffer.Data, (splitter->_Count - LEADING_DRAW_CHANNELS) * sizeof(ImDrawChannel));
    }
}